

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

bool Grammar::is_float_value(string *str)

{
  int iVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  string local_50;
  
  iVar7 = 0;
  if (str->_M_string_length == 0) {
    bVar3 = 0;
  }
  else {
    bVar3 = *(str->_M_dataplus)._M_p - 0x2b;
    iVar1 = (int)str->_M_string_length;
    uVar8 = (uint)((bVar3 & 0xfd) == 0);
    bVar5 = (int)uVar8 < iVar1;
    if ((int)uVar8 < iVar1) {
      uVar9 = (ulong)((bVar3 & 0xfd) == 0);
      uVar8 = 0;
      iVar7 = 0;
      do {
        bVar4 = str_utils::is_numeric((str->_M_dataplus)._M_p[uVar9]);
        if ((!bVar4) && (cVar2 = (str->_M_dataplus)._M_p[uVar9], cVar2 != '.')) {
          if (cVar2 == 'e') {
            if (iVar7 == 0 || 1 < uVar8) {
              str = (string *)0x0;
            }
            else {
              std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
              bVar4 = is_integer_value(&local_50);
              str = (string *)(ulong)bVar4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p);
              }
            }
            goto LAB_00140c41;
          }
          break;
        }
        cVar2 = (str->_M_dataplus)._M_p[uVar9];
        uVar8 = uVar8 + (cVar2 == '.');
        bVar5 = str_utils::is_numeric(cVar2);
        iVar7 = iVar7 + (uint)bVar5;
        uVar9 = uVar9 + 1;
        lVar6 = (long)(int)str->_M_string_length;
        bVar5 = (long)uVar9 < lVar6;
      } while ((long)uVar9 < lVar6);
      str = (string *)0x0;
    }
    else {
      uVar8 = 0;
    }
LAB_00140c41:
    bVar3 = (byte)str;
    if (!bVar5) {
      bVar3 = 0 < iVar7 && (int)uVar8 < 2;
    }
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool Grammar::is_float_value(const std::string& str) {
    if (str.size() == 0)
        return false;
    int count_point = 0, count_numeric = 0;
    for (int i = (str[0] == '+' || str[0] == '-') ? 1 : 0; i < int(str.size()); i++) {
        if (!str_utils::is_numeric(str[i]) && str[i] != '.') {
            if (str[i] != 'e')
                return false;
            return count_point <= 1 && count_numeric > 0 && is_integer_value(str.substr(i + 1));
        }
        if (str[i] == '.')
            count_point++;
        if (str_utils::is_numeric(str[i]))
            count_numeric++;
    }
    return count_point <= 1 && count_numeric > 0;
}